

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O3

HighsCDouble __thiscall
HighsHessian::objectiveCDoubleValue
          (HighsHessian *this,vector<double,_std::allocator<double>_> *solution)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  HighsCDouble HVar13;
  
  if ((long)this->dim_ < 1) {
    return (HighsCDouble)ZEXT816(0);
  }
  piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  dVar10 = 0.0;
  dVar9 = 0.0;
  iVar7 = *piVar3;
  do {
    dVar1 = pdVar4[lVar6];
    lVar8 = (long)iVar7;
    dVar12 = dVar1 * 0.5 * pdVar5[lVar8] * dVar1;
    dVar11 = dVar9 + dVar12;
    dVar10 = (dVar9 - (dVar11 - dVar12)) + (dVar12 - (dVar11 - (dVar11 - dVar12))) + dVar10;
    iVar2 = piVar3[lVar6 + 1];
    if (iVar7 + 1 < iVar2) {
      dVar9 = dVar11;
      do {
        dVar12 = pdVar5[lVar8 + 1] * dVar1 *
                 pdVar4[(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8 + 1]];
        dVar11 = dVar9 + dVar12;
        dVar10 = dVar10 + (dVar9 - (dVar11 - dVar12)) + (dVar12 - (dVar11 - (dVar11 - dVar12)));
        lVar8 = lVar8 + 1;
        dVar9 = dVar11;
      } while (iVar2 + -1 != (int)lVar8);
    }
    lVar6 = lVar6 + 1;
    dVar9 = dVar11;
    iVar7 = iVar2;
  } while (lVar6 != this->dim_);
  HVar13.lo = dVar10;
  HVar13.hi = dVar11;
  return HVar13;
}

Assistant:

HighsCDouble HighsHessian::objectiveCDoubleValue(
    const std::vector<double>& solution) const {
  HighsCDouble objective_function_value = HighsCDouble(0);
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    HighsInt iEl = this->start_[iCol];
    assert(this->index_[iEl] == iCol);
    objective_function_value +=
        0.5 * solution[iCol] * this->value_[iEl] * solution[iCol];
    for (HighsInt iEl = this->start_[iCol] + 1; iEl < this->start_[iCol + 1];
         iEl++)
      objective_function_value +=
          solution[iCol] * this->value_[iEl] * solution[this->index_[iEl]];
  }
  return objective_function_value;
}